

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O2

int __thiscall Algorithms::legendreSymbol(Algorithms *this,BigInteger *a,BigInteger *p)

{
  bool bVar1;
  uint uVar2;
  BigInteger local_a0;
  BigInteger local_80;
  BigInteger local_60;
  BigInteger local_40;
  
  BigIntegerLibrary::BigInteger::operator%(&local_80,a,p);
  BigIntegerLibrary::BigInteger::BigInteger(&local_a0,0);
  bVar1 = BigIntegerLibrary::BigInteger::operator==(&local_80,&local_a0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_a0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_80);
  uVar2 = 0;
  if (!bVar1) {
    BigIntegerLibrary::BigInteger::operator-(&local_40,p,1);
    BigIntegerLibrary::BigInteger::operator/(&local_a0,&local_40,2);
    BigIntegerLibrary::powm(&local_80,a,&local_a0,p);
    BigIntegerLibrary::BigInteger::BigInteger(&local_60,1);
    bVar1 = BigIntegerLibrary::BigInteger::operator==(&local_80,&local_60);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_60);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_80);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_a0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_40);
    uVar2 = bVar1 - 1 | 1;
  }
  return uVar2;
}

Assistant:

int Algorithms::legendreSymbol(BigInteger a, BigInteger p) {
    if (a % p == 0) {
        return 0;
    }
    if (powm(a, (p - 1) / 2, p) == 1) {
        return 1;
    }
    return -1;
}